

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
::~QExplicitlySharedDataPointerV2
          (QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
           *this)

{
  QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type_conflict)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>
                     *)0x0) {
        std::
        _Rb_tree<QSettingsIniKey,_std::pair<const_QSettingsIniKey,_QVariant>,_std::_Select1st<std::pair<const_QSettingsIniKey,_QVariant>_>,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>
        ::~_Rb_tree(&(pQVar1->m)._M_t);
      }
      operator_delete(pQVar1,0x38);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }